

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

size_t __thiscall google::protobuf::internal::ExtensionSet::ByteSize(ExtensionSet *this)

{
  LargeMap *pLVar1;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> it;
  size_t total_size;
  size_t local_28;
  anon_class_8_1_736c71da local_20;
  
  local_20.total_size = &local_28;
  local_28 = 0;
  if ((short)this->flat_size_ < 0) {
    pLVar1 = (this->map_).large;
    for (p_Var4 = (pLVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pLVar1->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      ByteSize::anon_class_8_1_736c71da::operator()
                (&local_20,p_Var4[1]._M_color,(Extension *)&p_Var4[1]._M_parent);
    }
  }
  else {
    pKVar2 = flat_begin(this);
    pKVar3 = flat_end(this);
    local_20.total_size = &local_28;
    for (; pKVar2 != pKVar3; pKVar2 = pKVar2 + 1) {
      ByteSize::anon_class_8_1_736c71da::operator()(&local_20,pKVar2->first,&pKVar2->second);
    }
  }
  return local_28;
}

Assistant:

size_t ExtensionSet::ByteSize() const {
  size_t total_size = 0;
  ForEach([&total_size](int number, const Extension& ext) {
    total_size += ext.ByteSize(number);
  });
  return total_size;
}